

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

optional<uint256> * __thiscall
ChainstateManager::SnapshotBlockhash
          (optional<uint256> *__return_storage_ptr__,ChainstateManager *this)

{
  Chainstate *pCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &cs_main.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  pCVar1 = this->m_active_chainstate;
  if ((pCVar1 == (Chainstate *)0x0) ||
     ((pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged != true)) {
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
    super__Optional_payload_base<uint256>._M_engaged =
         (pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>._M_payload.
         super__Optional_payload_base<uint256>._M_engaged;
    uVar2 = *(undefined8 *)
             &(pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
              _M_payload.super__Optional_payload_base<uint256>._M_payload;
    uVar3 = *(undefined8 *)
             ((long)&(pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload + 8);
    uVar4 = *(undefined8 *)
             ((long)&(pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                     _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x18);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x10) =
         *(undefined8 *)
          ((long)&(pCVar1->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
                  _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x18) = uVar4;
    *(undefined8 *)
     &(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
      super__Optional_payload_base<uint256>._M_payload = uVar2;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<uint256,_true,_true>)._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 8) = uVar3;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<uint256> ChainstateManager::SnapshotBlockhash() const
{
    LOCK(::cs_main);
    if (m_active_chainstate && m_active_chainstate->m_from_snapshot_blockhash) {
        // If a snapshot chainstate exists, it will always be our active.
        return m_active_chainstate->m_from_snapshot_blockhash;
    }
    return std::nullopt;
}